

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O1

double __thiscall VCCluster::energy(VCCluster *this)

{
  double dVar1;
  double dVar2;
  Vector3d zi;
  double local_28;
  double dStack_20;
  double local_18;
  
  (*this->_vptr_VCCluster[7])(&local_28,this);
  dVar1 = this->area;
  dVar2 = 0.0;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar2 = dStack_20 *
            (this->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[1] +
            local_18 *
            (this->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[2] +
            local_28 *
            (this->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[0];
    dVar2 = dVar1 * (dStack_20 * dStack_20 + local_18 * local_18 + local_28 * local_28) -
            (dVar2 + dVar2);
  }
  return dVar2;
}

Assistant:

double VCCluster::energy() {
	Vector3d zi = center();
	return area == 0 ? ENG_NULL : area * zi.dot(zi) - 2 * zi.dot(weightedSum);
}